

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  lyxp_token lVar1;
  uint32_t uVar2;
  uint tok_idx_00;
  lyxp_token *plVar3;
  uint uVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  size_t sStackY_70;
  char *local_58;
  char *local_48;
  
  LVar5 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NONE);
  if (LVar5 != LY_SUCCESS) {
    return LY_EVALID;
  }
  uVar8 = *tok_idx;
  switch(exp->tokens[uVar8]) {
  case LYXP_TOKEN_PAR1:
    *tok_idx = uVar8 + 1;
    LVar5 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    LVar5 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_PAR2);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    uVar8 = *tok_idx;
  case LYXP_TOKEN_VARREF:
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    *tok_idx = uVar8 + 1;
LAB_0019e634:
    while( true ) {
      uVar8 = *tok_idx;
      if (exp->used == uVar8) {
        return LY_SUCCESS;
      }
      if (exp->tokens[uVar8] != LYXP_TOKEN_BRACK1) break;
      LVar5 = reparse_predicate(ctx,exp,tok_idx,depth);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
    if ((exp->tokens[uVar8] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH) {
      return LY_SUCCESS;
    }
    *tok_idx = uVar8 + 1;
    goto switchD_0019e4e1_caseD_5;
  default:
    pcVar7 = lyxp_token2str(exp->tokens[uVar8]);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar7,
            exp->expr + exp->tok_pos[*tok_idx]);
    return LY_EVALID;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
  case LYXP_TOKEN_AXISNAME:
    goto switchD_0019e4e1_caseD_5;
  case LYXP_TOKEN_FUNCNAME:
    LVar5 = lyxp_check_token(ctx,exp,uVar8,LYXP_TOKEN_FUNCNAME);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    break;
  case LYXP_TOKEN_OPER_PATH:
  case LYXP_TOKEN_OPER_RPATH:
    LVar5 = exp_check_token2(ctx,exp,uVar8,LYXP_TOKEN_OPER_PATH,LYXP_TOKEN_OPER_RPATH);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    plVar3 = exp->tokens;
    uVar8 = *tok_idx + 1;
    lVar1 = plVar3[*tok_idx];
    *tok_idx = uVar8;
    if (lVar1 == LYXP_TOKEN_OPER_PATH) {
      if (exp->used == uVar8) {
        return LY_SUCCESS;
      }
      lVar1 = plVar3[uVar8];
      if (LYXP_TOKEN_AXISNAME < lVar1) {
        return LY_SUCCESS;
      }
      if ((0x400ce0U >> (lVar1 & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) == 0) {
        return LY_SUCCESS;
      }
    }
switchD_0019e4e1_caseD_5:
    LVar5 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
    if (LVar5 == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    return LVar5;
  }
  uVar8 = *tok_idx;
  uVar12 = exp->tok_len[uVar8];
  pcVar7 = exp->expr;
  uVar10 = (ulong)exp->tok_pos[uVar8];
  switch(uVar12) {
  case 3:
    if (pcVar7[uVar10] == 's') {
      if ((pcVar7[uVar10 + 1] != 'u') || (pcVar7[uVar10 + 2] != 'm')) goto switchD_0019e58e_caseD_e;
    }
    else if ((pcVar7[uVar10] != 'n') || ((pcVar7[uVar10 + 1] != 'o' || (pcVar7[uVar10 + 2] != 't')))
            ) goto switchD_0019e58e_caseD_e;
    goto LAB_0019eb4e;
  case 4:
    pcVar11 = pcVar7 + uVar10;
    iVar6 = strncmp(pcVar11,"lang",4);
    uVar9 = 1;
    if (iVar6 == 0) {
      uVar4 = 1;
      goto LAB_0019eacf;
    }
    iVar6 = strncmp(pcVar11,"last",4);
    uVar4 = 0;
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar11,"name",4);
      if (iVar6 != 0) {
        iVar6 = strncmp(pcVar11,"true",4);
        uVar9 = 0;
        goto joined_r0x0019e852;
      }
      goto LAB_0019eaaa;
    }
    break;
  case 5:
    pcVar11 = pcVar7 + uVar10;
    iVar6 = strncmp(pcVar11,"count",5);
    uVar9 = 1;
    uVar4 = 1;
    if (iVar6 == 0) goto LAB_0019eacf;
    iVar6 = strncmp(pcVar11,"false",5);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar11,"floor",5);
      if ((iVar6 != 0) && (iVar6 = strncmp(pcVar11,"round",5), iVar6 != 0)) {
        iVar6 = strncmp(pcVar11,"deref",5);
        uVar9 = 1;
        goto joined_r0x0019e852;
      }
      goto LAB_0019eaaa;
    }
    break;
  case 6:
    iVar6 = strncmp(pcVar7 + uVar10,"concat",6);
    if (iVar6 == 0) {
      uVar9 = 0xffffffff;
      goto LAB_0019eac7;
    }
    iVar6 = strncmp(pcVar7 + uVar10,"number",6);
    uVar4 = 0;
    if (iVar6 != 0) {
      pcVar11 = "string";
      sStackY_70 = 6;
      goto LAB_0019e83d;
    }
    goto LAB_0019eaaa;
  case 7:
    pcVar11 = pcVar7 + uVar10;
    iVar6 = strncmp(pcVar11,"boolean",7);
    uVar9 = 1;
    uVar4 = 1;
    if (iVar6 == 0) goto LAB_0019eacf;
    iVar6 = strncmp(pcVar11,"ceiling",7);
    uVar9 = 1;
    if (iVar6 == 0) goto LAB_0019eacf;
    iVar6 = strncmp(pcVar11,"current",7);
    if (iVar6 != 0) goto switchD_0019e58e_caseD_e;
    break;
  case 8:
    pcVar11 = pcVar7 + uVar10;
    iVar6 = strncmp(pcVar11,"contains",8);
    uVar9 = 2;
    uVar4 = 2;
    if (iVar6 == 0) goto LAB_0019eacf;
    iVar6 = strncmp(pcVar11,"position",8);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar11,"re-match",8);
      uVar9 = 2;
      goto joined_r0x0019e852;
    }
    break;
  case 9:
    iVar6 = strncmp(pcVar7 + uVar10,"substring",9);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7 + uVar10,"translate",9);
      if (iVar6 == 0) {
        uVar9 = 3;
        uVar4 = uVar9;
        goto LAB_0019eacf;
      }
      goto switchD_0019e58e_caseD_e;
    }
    uVar9 = 3;
LAB_0019eac7:
    uVar4 = 2;
    goto LAB_0019eacf;
  case 10:
    iVar6 = strncmp(pcVar7 + uVar10,"local-name",10);
    if (iVar6 == 0) {
LAB_0019eaa2:
      uVar4 = 0;
      goto LAB_0019eaaa;
    }
    iVar6 = strncmp(pcVar7 + uVar10,"enum-value",10);
    if (iVar6 != 0) {
      pcVar11 = "bit-is-set";
      sStackY_70 = 10;
      goto LAB_0019ea23;
    }
LAB_0019eb4e:
    uVar9 = 1;
    uVar4 = uVar9;
    goto LAB_0019eacf;
  case 0xb:
    pcVar11 = "starts-with";
    sStackY_70 = 0xb;
    goto LAB_0019ea5f;
  case 0xc:
    pcVar11 = "derived-from";
    sStackY_70 = 0xc;
    goto LAB_0019ea5f;
  case 0xd:
    iVar6 = strncmp(pcVar7 + uVar10,"namespace-uri",0xd);
    uVar4 = 0;
    if (iVar6 != 0) {
      pcVar11 = "string-length";
      sStackY_70 = 0xd;
LAB_0019e83d:
      uVar4 = 0;
      local_48 = pcVar7 + uVar10;
      iVar6 = strncmp(local_48,pcVar11,sStackY_70);
      uVar9 = 1;
joined_r0x0019e852:
      if (iVar6 != 0) goto switchD_0019e58e_caseD_e;
      goto LAB_0019eacf;
    }
LAB_0019eaaa:
    uVar9 = 1;
    goto LAB_0019eacf;
  default:
    goto switchD_0019e58e_caseD_e;
  case 0xf:
    iVar6 = strncmp(pcVar7 + uVar10,"normalize-space",0xf);
    if (iVar6 == 0) goto LAB_0019eaa2;
    pcVar11 = "substring-after";
    sStackY_70 = 0xf;
LAB_0019ea23:
    local_58 = pcVar7 + uVar10;
    iVar6 = strncmp(local_58,pcVar11,sStackY_70);
    goto joined_r0x0019ea6c;
  case 0x10:
    pcVar11 = "substring-before";
    sStackY_70 = 0x10;
    goto LAB_0019ea5f;
  case 0x14:
    pcVar11 = "derived-from-or-self";
    sStackY_70 = 0x14;
LAB_0019ea5f:
    iVar6 = strncmp(pcVar7 + uVar10,pcVar11,sStackY_70);
joined_r0x0019ea6c:
    if (iVar6 != 0) {
switchD_0019e58e_caseD_e:
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unknown XPath function \"%.*s\".",(ulong)uVar12,
              pcVar7 + uVar10);
      return LY_EINVAL;
    }
    uVar9 = 2;
    uVar4 = uVar9;
    goto LAB_0019eacf;
  }
  uVar9 = 0;
  uVar4 = 0;
LAB_0019eacf:
  *tok_idx = uVar8 + 1;
  LVar5 = lyxp_check_token(ctx,exp,uVar8 + 1,LYXP_TOKEN_PAR1);
  if (LVar5 == LY_SUCCESS) {
    uVar2 = *tok_idx;
    *tok_idx = uVar2 + 1;
    uVar12 = 0;
    LVar5 = lyxp_check_token(ctx,exp,uVar2 + 1,LYXP_TOKEN_NONE);
    if (LVar5 == LY_SUCCESS) {
      if (exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2) goto LAB_0019eb5d;
      LVar5 = reparse_or_expr(ctx,exp,tok_idx,depth);
      uVar12 = 1;
      while (LVar5 == LY_SUCCESS) {
LAB_0019eb5d:
        tok_idx_00 = *tok_idx;
        if ((exp->used == tok_idx_00) || (exp->tokens[tok_idx_00] != LYXP_TOKEN_COMMA)) {
          LVar5 = lyxp_check_token(ctx,exp,tok_idx_00,LYXP_TOKEN_PAR2);
          if (LVar5 != LY_SUCCESS) {
            return LVar5;
          }
          *tok_idx = *tok_idx + 1;
          if (uVar12 < uVar4 || uVar9 < uVar12) {
            ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                    "Invalid number of arguments (%u) for the XPath function %.*s.",(ulong)uVar12,
                    (ulong)exp->tok_len[uVar8],exp->expr + exp->tok_pos[uVar8]);
            return LY_EVALID;
          }
          goto LAB_0019e634;
        }
        *tok_idx = tok_idx_00 + 1;
        uVar12 = uVar12 + 1;
        LVar5 = reparse_or_expr(ctx,exp,tok_idx,depth);
      }
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
reparse_path_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    LY_ERR rc;

    if (lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NONE)) {
        return LY_EVALID;
    }

    switch (exp->tokens[*tok_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*tok_idx);

        rc = reparse_or_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);

        rc = lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_PAR2);
        LY_CHECK_RET(rc);
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AXISNAME:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_VARREF:
        /* VariableReference */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        rc = reparse_function_call(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        goto predicate;
    case LYXP_TOKEN_OPER_PATH:
    case LYXP_TOKEN_OPER_RPATH:
        /* AbsoluteLocationPath */
        rc = reparse_absolute_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*tok_idx);
        goto predicate;
    default:
        LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), &exp->expr[exp->tok_pos[*tok_idx]]);
        return LY_EVALID;
    }

    return LY_SUCCESS;

predicate:
    /* Predicate* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_BRACK1)) {
        rc = reparse_predicate(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    /* ('/' or '//') RelativeLocationPath */
    if (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH)) {

        /* '/' or '//' */
        ++(*tok_idx);

        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}